

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgProgramGenerator.cpp
# Opt level: O0

void __thiscall
rsg::ProgramGenerator::generate
          (ProgramGenerator *this,ProgramParameters *programParams,Shader *vertexShader,
          Shader *fragmentShader)

{
  pointer *this_00;
  NameAllocator **this_01;
  int iVar1;
  bool bVar2;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *pvVar3;
  reference ppSVar4;
  Variable *pVVar5;
  VariableType *pVVar6;
  ConstStridedValueAccess<1> CVar7;
  ValueRangeAccess local_278;
  ConstStridedValueAccess<1> local_260;
  ValueRangeAccess local_250;
  ConstStridedValueAccess<1> local_238;
  ShaderInput *local_228;
  ShaderInput *input;
  __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_218;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_210;
  const_iterator i_2;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_200;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_1f8;
  const_iterator i_1;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_1e8;
  __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_1e0;
  const_iterator i;
  undefined1 local_1d0 [4];
  int curSamplerNdx;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> unifiedSamplers;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *fragmentUniforms;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *vertexUniforms;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *fragmentInputs;
  ShaderGenerator shaderGen_1;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> emptyOutputs;
  ShaderGenerator shaderGen;
  undefined1 local_a8 [8];
  GeneratorState state;
  Random rnd;
  Shader *fragmentShader_local;
  Shader *vertexShader_local;
  ProgramParameters *programParams_local;
  ProgramGenerator *this_local;
  
  this_00 = &state.m_precedenceStack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  de::Random::Random((Random *)this_00,programParams->seed);
  GeneratorState::GeneratorState((GeneratorState *)local_a8,programParams,(Random *)this_00);
  ShaderGenerator::ShaderGenerator
            ((ShaderGenerator *)
             &emptyOutputs.
              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(GeneratorState *)local_a8);
  this_01 = &shaderGen_1.m_varManager.m_nameAllocator;
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::vector
            ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)this_01);
  ShaderGenerator::generate
            ((ShaderGenerator *)
             &emptyOutputs.
              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&programParams->fragmentParameters,
             fragmentShader,
             (vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)this_01);
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~vector
            ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)
             &shaderGen_1.m_varManager.m_nameAllocator);
  ShaderGenerator::~ShaderGenerator
            ((ShaderGenerator *)
             &emptyOutputs.
              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ShaderGenerator::ShaderGenerator((ShaderGenerator *)&fragmentInputs,(GeneratorState *)local_a8);
  pvVar3 = rsg::Shader::getInputs(fragmentShader);
  ShaderGenerator::generate
            ((ShaderGenerator *)&fragmentInputs,&programParams->vertexParameters,vertexShader,pvVar3
            );
  ShaderGenerator::~ShaderGenerator((ShaderGenerator *)&fragmentInputs);
  pvVar3 = rsg::Shader::getUniforms(vertexShader);
  unifiedSamplers.super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)rsg::Shader::getUniforms(fragmentShader);
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::vector
            ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)local_1d0);
  i._M_current._4_4_ = 0;
  local_1e0._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(pvVar3);
  while( true ) {
    local_1e8._M_current =
         (ShaderInput **)
         std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end(pvVar3);
    bVar2 = __gnu_cxx::operator!=(&local_1e0,&local_1e8);
    if (!bVar2) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_1e0);
    pVVar5 = ShaderInput::getVariable(*ppSVar4);
    pVVar6 = rsg::Variable::getType(pVVar5);
    bVar2 = VariableType::isSampler(pVVar6);
    if (bVar2) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                ::operator*(&local_1e0);
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::push_back
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)local_1d0,
                 ppSVar4);
    }
    i_1._M_current =
         (ShaderInput **)
         __gnu_cxx::
         __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
         ::operator++(&local_1e0,0);
  }
  local_1f8._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin
                 ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)
                  unifiedSamplers.
                  super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_200._M_current =
         (ShaderInput **)
         std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end
                   ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)
                    unifiedSamplers.
                    super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=(&local_1f8,&local_200);
    if (!bVar2) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_1f8);
    pVVar5 = ShaderInput::getVariable(*ppSVar4);
    pVVar6 = rsg::Variable::getType(pVVar5);
    bVar2 = VariableType::isSampler(pVVar6);
    if (bVar2) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                ::operator*(&local_1f8);
      std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::push_back
                ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)local_1d0,
                 ppSVar4);
    }
    i_2._M_current =
         (ShaderInput **)
         __gnu_cxx::
         __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
         ::operator++(&local_1f8,0);
  }
  local_218._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin
                 ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)local_1d0);
  __gnu_cxx::
  __normal_iterator<rsg::ShaderInput*const*,std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>>
  ::__normal_iterator<rsg::ShaderInput**>
            ((__normal_iterator<rsg::ShaderInput*const*,std::vector<rsg::ShaderInput*,std::allocator<rsg::ShaderInput*>>>
              *)&local_210,&local_218);
  while( true ) {
    input = (ShaderInput *)
            std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end
                      ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)local_1d0)
    ;
    bVar2 = __gnu_cxx::operator!=
                      (&local_210,
                       (__normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
                        *)&input);
    if (!bVar2) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_210);
    local_228 = *ppSVar4;
    pVVar5 = ShaderInput::getVariable(local_228);
    pVVar6 = rsg::Variable::getType(pVVar5);
    bVar2 = VariableType::isSampler(pVVar6);
    iVar1 = i._M_current._4_4_;
    if (bVar2) {
      ShaderInput::getValueRange(&local_250,local_228);
      CVar7 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMin(&local_250);
      local_238 = CVar7;
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_238,iVar1);
      iVar1 = i._M_current._4_4_;
      ShaderInput::getValueRange(&local_278,local_228);
      CVar7 = (ConstStridedValueAccess<1>)ValueRangeAccess::getMax(&local_278);
      local_260 = CVar7;
      StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_260,iVar1);
      i._M_current._4_4_ = i._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<rsg::ShaderInput_*const_*,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
    ::operator++(&local_210,0);
  }
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::~vector
            ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)local_1d0);
  GeneratorState::~GeneratorState((GeneratorState *)local_a8);
  de::Random::~Random((Random *)
                      &state.m_precedenceStack.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ProgramGenerator::generate (
	const ProgramParameters&	programParams,
	Shader&						vertexShader,
	Shader&						fragmentShader)
{
	// Random number generator
	de::Random rnd(programParams.seed);

	GeneratorState state(programParams, rnd);

	// Fragment shader
	{
		ShaderGenerator			shaderGen(state);
		vector<ShaderInput*>	emptyOutputs; // \note [pyry] gl_FragColor is added in ShaderGenerator
		shaderGen.generate(programParams.fragmentParameters, fragmentShader, emptyOutputs);
	}

	// Vertex shader
	{
		ShaderGenerator shaderGen(state);

		// Initialize outputs from fragment shader inputs
		const vector<ShaderInput*>& fragmentInputs = fragmentShader.getInputs(); // \note gl_Position and dEQP_Position are handled in ShaderGenerator

		shaderGen.generate(programParams.vertexParameters, vertexShader, fragmentInputs);
	}

	// Allocate samplers \todo [pyry] Randomize allocation.
	{
		const vector<ShaderInput*>&		vertexUniforms		= vertexShader.getUniforms();
		const vector<ShaderInput*>&		fragmentUniforms	= fragmentShader.getUniforms();
		vector<ShaderInput*>			unifiedSamplers;
		int								curSamplerNdx	= 0;

		// Build unified sampler list.
		for (vector<ShaderInput*>::const_iterator i = vertexUniforms.begin(); i != vertexUniforms.end(); i++)
		{
			if ((*i)->getVariable()->getType().isSampler())
				unifiedSamplers.push_back(*i);
		}

		for (vector<ShaderInput*>::const_iterator i = fragmentUniforms.begin(); i != fragmentUniforms.end(); i++)
		{
			if ((*i)->getVariable()->getType().isSampler())
				unifiedSamplers.push_back(*i);
		}

		// Assign sampler indices.
		for (vector<ShaderInput*>::const_iterator i = unifiedSamplers.begin(); i != unifiedSamplers.end(); i++)
		{
			ShaderInput* input = *i;
			if (input->getVariable()->getType().isSampler())
			{
				input->getValueRange().getMin() = curSamplerNdx;
				input->getValueRange().getMax() = curSamplerNdx;
				curSamplerNdx += 1;
			}
		}
	}
}